

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O2

TonkResult
tonk_connect(TonkSocket tonkSocket,TonkConnectionConfig config,char *hostname,uint16_t port,
            TonkConnection *connectionOut,TonkJson *errorJsonOut)

{
  TonkResult TVar1;
  ErrorResult *pEVar2;
  allocator local_61;
  Result result;
  undefined1 local_58 [40];
  
  result.Error = (ErrorResult *)0x0;
  if ((hostname == (char *)0x0 || tonkSocket == (TonkSocket)0x0) ||
      connectionOut == (TonkConnection *)0x0) {
    std::__cxx11::string::string((string *)local_58,"Null parameter",&local_61);
    pEVar2 = (ErrorResult *)operator_new(0x38);
    pEVar2->Source = "tonk_connect";
    std::__cxx11::string::string((string *)&pEVar2->Description,(string *)local_58);
  }
  else {
    *connectionOut = (TonkConnection)0x0;
    if ((config.OnClose == (_func_void_TonkAppContextPtr_TonkConnection_TonkResult_char_ptr *)0x0)
       && (config.OnData !=
           (_func_void_TonkAppContextPtr_TonkConnection_uint32_t_uint8_t_ptr_uint32_t *)0x0 ||
           config.OnTick != (_func_void_TonkAppContextPtr_TonkConnection_uint64_t *)0x0)) {
      std::__cxx11::string::string
                ((string *)local_58,
                 "OnClose cannot be null: Other callbacks are specified and could be called after tonk_free().  The application should use OnClose() to call tonk_free()."
                 ,&local_61);
      pEVar2 = (ErrorResult *)operator_new(0x38);
      pEVar2->Source = "ValidateTonkConnectionConfig";
      std::__cxx11::string::string((string *)&pEVar2->Description,(string *)local_58);
      pEVar2->Type = Tonk;
      pEVar2->Code = 1;
      std::__cxx11::string::~string((string *)local_58);
    }
    else {
      pEVar2 = (ErrorResult *)0x0;
    }
    local_58._32_8_ = 0;
    result.Error = pEVar2;
    tonk::Result::~Result((Result *)(local_58 + 0x20));
    if (result.Error != (ErrorResult *)0x0) goto LAB_0013e950;
    if (port != 0) {
      tonk::ApplicationSession::tonk_connect
                ((ApplicationSession *)local_58,config,(char *)tonkSocket,(uint16_t)hostname,
                 (TonkConnection *)(ulong)port);
      result.Error = (ErrorResult *)local_58._0_8_;
      local_58._0_8_ = (ErrorResult *)0x0;
      tonk::Result::~Result((Result *)local_58);
      goto LAB_0013e950;
    }
    std::__cxx11::string::string((string *)local_58,"Port was not set",&local_61);
    pEVar2 = (ErrorResult *)operator_new(0x38);
    pEVar2->Source = "tonk_connect";
    std::__cxx11::string::string((string *)&pEVar2->Description,(string *)local_58);
  }
  pEVar2->Type = Tonk;
  pEVar2->Code = 2;
  local_58._32_8_ = 0;
  result.Error = pEVar2;
  tonk::Result::~Result((Result *)(local_58 + 0x20));
  std::__cxx11::string::~string((string *)local_58);
LAB_0013e950:
  if (errorJsonOut != (TonkJson *)0x0) {
    tonk::Result::ToJson_abi_cxx11_((string *)local_58,&result);
    strncpy(errorJsonOut->JsonString,(char *)local_58._0_8_,0x400);
    errorJsonOut->JsonString[0x3ff] = '\0';
    std::__cxx11::string::~string((string *)local_58);
  }
  TVar1 = TonkResultFromDetailedResult(&result);
  tonk::Result::~Result(&result);
  return TVar1;
}

Assistant:

TONK_EXPORT TonkResult tonk_connect(
    TonkSocket          tonkSocket, // Socket to connect from
    TonkConnectionConfig    config, // Configuration for the connection
    const char*           hostname, // Hostname of the remote host
    uint16_t                  port, // Port for the remote host
    TonkConnection*  connectionOut, // Set to connection on success, else 0
    TonkJson*         errorJsonOut  // Receives detailed error message on error
)
{
    SIAMESE_DEBUG_ASSERT(hostname != nullptr); // Invalid input

    Result result;

    if (!tonkSocket || !hostname || !connectionOut)
        result = Result("tonk_connect", "Null parameter");
    else
    {
        *connectionOut = nullptr;

        result = ValidateTonkConnectionConfig(&config);
        if (result.IsFail())
        {
            TONK_DEBUG_BREAK(); // Invalid input
        }
        else
        {
            ApplicationSession* session = reinterpret_cast<ApplicationSession*>(tonkSocket);

            if (port == 0)
                result = Result("tonk_connect", "Port was not set");
            else
            {
                result = session->tonk_connect(
                    config,
                    hostname,
                    port,
                    connectionOut);
            }
        }
    }

    // Write optional error json object
    if (errorJsonOut)
        SafeCopyCStr(
            errorJsonOut->JsonString,
            TONK_ERROR_JSON_MAX_BYTES,
            result.ToJson().c_str());
    return TonkResultFromDetailedResult(result);
}